

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::Url::QueryParam> * __thiscall
kj::ArrayBuilder<kj::Url::QueryParam>::operator=
          (ArrayBuilder<kj::Url::QueryParam> *this,ArrayBuilder<kj::Url::QueryParam> *other)

{
  ArrayBuilder<kj::Url::QueryParam> *other_local;
  ArrayBuilder<kj::Url::QueryParam> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (QueryParam *)0x0;
  other->pos = (RemoveConst<kj::Url::QueryParam> *)0x0;
  other->endPtr = (QueryParam *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }